

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strchr32_63(UChar *s,UChar32 c)

{
  UChar UVar1;
  UChar *pUVar2;
  
  if ((uint)c < 0x10000) {
    pUVar2 = u_strchr_63(s,(UChar)c);
    return pUVar2;
  }
  if ((uint)c < 0x110000) {
    while (UVar1 = *s, UVar1 != L'\0') {
      pUVar2 = s;
      s = s + 1;
      if ((((uint)c >> 10) + 0xd7c0 == (uint)(ushort)UVar1) &&
         ((c & 0x3ffU | 0xdc00) == (uint)(ushort)*s)) {
        return pUVar2;
      }
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                return (UChar *)(s-1);
            }
        }
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}